

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_node_set_raw * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_node_set
          (xpath_ast_node *this,xpath_context *c,xpath_stack *stack,nodeset_eval_t eval)

{
  type_t tVar1;
  unspecified_bool_type p_Var2;
  unspecified_bool_type p_Var3;
  xpath_node_set *this_00;
  xpath_context *in_RCX;
  xpath_node_set_raw *this_01;
  xpath_ast_node *in_RDX;
  xpath_node *in_RSI;
  xpath_ast_node *in_RDI;
  nodeset_eval_t in_R8D;
  xpath_node_set_raw *set;
  xpath_node_set *s;
  bool once;
  xpath_node_set_raw rs;
  xpath_stack swapped_stack;
  xpath_allocator_capture cr;
  xpath_node *in_stack_fffffffffffffed8;
  xpath_node_set_raw *in_stack_fffffffffffffee0;
  undefined1 once_00;
  xpath_node *in_stack_fffffffffffffee8;
  xpath_node_set_raw *in_stack_fffffffffffffef0;
  xpath_ast_node *pxVar4;
  xml_attribute local_c0;
  xml_node_struct *local_b8;
  xml_node_struct *local_b0;
  xml_node local_98 [2];
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  xpath_node_set_raw *in_stack_ffffffffffffff80;
  nodeset_eval_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  this_01 = (xpath_node_set_raw *)(ulong)((int)*(char *)&(in_RSI->_node)._root - 0xf);
  pxVar4 = in_RDI;
  switch(this_01) {
  case (xpath_node_set_raw *)0x0:
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&stack0xffffffffffffffc0,
               (xpath_allocator *)(in_RCX->n)._attribute._attr);
    eval_node_set(in_RDX,in_RCX,(xpath_stack *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),
                  in_stack_ffffffffffffffdc);
    eval_node_set(in_RDX,in_RCX,(xpath_stack *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),
                  in_stack_ffffffffffffffdc);
    xpath_node_set_raw::set_type((xpath_node_set_raw *)in_RDI,type_unsorted);
    xpath_node_set_raw::begin((xpath_node_set_raw *)&stack0xffffffffffffff80);
    xpath_node_set_raw::end((xpath_node_set_raw *)&stack0xffffffffffffff80);
    xpath_node_set_raw::append(this_01,in_RSI,(xpath_node *)pxVar4,(xpath_allocator *)in_RDI);
    xpath_node_set_raw::remove_duplicates
              (in_stack_ffffffffffffff80,
               (xpath_allocator *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x12d7b2);
    break;
  case (xpath_node_set_raw *)0x2:
    eval_node_set(in_RDX,in_RCX,(xpath_stack *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),
                  in_stack_ffffffffffffffdc);
    if (*(char *)((long)&(in_RSI->_node)._root + 3) != '\x01') {
      xpath_node_set_raw::sort_do(in_stack_fffffffffffffee0);
    }
    once_00 = (undefined1)((ulong)in_stack_fffffffffffffee0 >> 0x38);
    tVar1 = xpath_node_set_raw::type((xpath_node_set_raw *)in_RDI);
    eval_once(tVar1,in_R8D);
    apply_predicate(pxVar4,(xpath_node_set_raw *)in_RDI,(size_t)in_stack_fffffffffffffef0,
                    (xpath_stack *)in_stack_fffffffffffffee8,(bool)once_00);
    break;
  case (xpath_node_set_raw *)0x5:
    if (*(char *)((long)&(in_RSI->_node)._root + 1) == '\x01') {
      this_00 = xpath_variable::get_node_set((xpath_variable *)in_RSI[2]._node._root);
      xpath_node_set_raw::xpath_node_set_raw((xpath_node_set_raw *)in_RDI);
      tVar1 = xpath_node_set::type(this_00);
      xpath_node_set_raw::set_type((xpath_node_set_raw *)in_RDI,tVar1);
      xpath_node_set::begin(this_00);
      xpath_node_set::end(this_00);
      xpath_node_set_raw::append(this_01,in_RSI,(xpath_node *)pxVar4,(xpath_allocator *)in_RDI);
      return (xpath_node_set_raw *)pxVar4;
    }
  default:
    xpath_node_set_raw::xpath_node_set_raw((xpath_node_set_raw *)in_RDI);
    pxVar4 = in_RDI;
    break;
  case (xpath_node_set_raw *)0x9:
    xpath_node_set_raw::xpath_node_set_raw((xpath_node_set_raw *)in_RDI);
    pxVar4 = in_RDI;
    break;
  case (xpath_node_set_raw *)0x29:
    switch(*(undefined1 *)((long)&(in_RSI->_node)._root + 2)) {
    case 0:
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)0>_>
                (in_RDI,in_RSI,in_RDX,in_RCX,in_R8D);
      pxVar4 = in_RDI;
      break;
    case 1:
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)1>_>
                (in_RDI,in_RSI,in_RDX,in_RCX,in_R8D);
      pxVar4 = in_RDI;
      break;
    case 2:
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)2>_>
                (in_RDI,in_RSI,in_RDX,in_RCX,in_R8D);
      pxVar4 = in_RDI;
      break;
    case 3:
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)3>_>
                (in_RDI,in_RSI,in_RDX,in_RCX,in_R8D);
      pxVar4 = in_RDI;
      break;
    case 4:
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)4>_>
                (in_RDI,in_RSI,in_RDX,in_RCX,in_R8D);
      pxVar4 = in_RDI;
      break;
    case 5:
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)5>_>
                (in_RDI,in_RSI,in_RDX,in_RCX,in_R8D);
      pxVar4 = in_RDI;
      break;
    case 6:
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)6>_>
                (in_RDI,in_RSI,in_RDX,in_RCX,in_R8D);
      pxVar4 = in_RDI;
      break;
    case 7:
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)7>_>
                (in_RDI,in_RSI,in_RDX,in_RCX,in_R8D);
      pxVar4 = in_RDI;
      break;
    case 8:
      xpath_node_set_raw::xpath_node_set_raw((xpath_node_set_raw *)in_RDI);
      pxVar4 = in_RDI;
      break;
    case 9:
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)9>_>
                (in_RDI,in_RSI,in_RDX,in_RCX,in_R8D);
      pxVar4 = in_RDI;
      break;
    case 10:
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)10>_>
                (in_RDI,in_RSI,in_RDX,in_RCX,in_R8D);
      pxVar4 = in_RDI;
      break;
    case 0xb:
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)11>_>
                (in_RDI,in_RSI,in_RDX,in_RCX,in_R8D);
      pxVar4 = in_RDI;
      break;
    case 0xc:
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)12>_>
                (in_RDI,in_RSI,in_RDX,in_RCX,in_R8D);
      pxVar4 = in_RDI;
      break;
    default:
      xpath_node_set_raw::xpath_node_set_raw((xpath_node_set_raw *)in_RDI);
      pxVar4 = in_RDI;
    }
    break;
  case (xpath_node_set_raw *)0x2a:
    xpath_node_set_raw::xpath_node_set_raw((xpath_node_set_raw *)in_RDI);
    xpath_node_set_raw::set_type((xpath_node_set_raw *)in_RDI,type_sorted);
    local_98[0] = xpath_node::node(in_stack_fffffffffffffed8);
    p_Var2 = xml_node::operator_cast_to_function_pointer(local_98);
    if (p_Var2 == (unspecified_bool_type)0x0) {
      local_c0 = xpath_node::attribute((xpath_node *)in_RDX);
      p_Var3 = xml_attribute::operator_cast_to_function_pointer(&local_c0);
      if (p_Var3 != (unspecified_bool_type)0x0) {
        xpath_node::parent(in_stack_fffffffffffffed8);
        xml_node::root(&in_stack_fffffffffffffed8->_node);
        xpath_node::xpath_node
                  ((xpath_node *)in_stack_fffffffffffffee0,&in_stack_fffffffffffffed8->_node);
        xpath_node_set_raw::push_back
                  (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                   (xpath_allocator *)in_stack_fffffffffffffee0);
      }
    }
    else {
      local_b8 = (xml_node_struct *)xpath_node::node(in_stack_fffffffffffffed8);
      local_b0 = (xml_node_struct *)xml_node::root(&in_stack_fffffffffffffed8->_node);
      xpath_node::xpath_node
                ((xpath_node *)in_stack_fffffffffffffee0,&in_stack_fffffffffffffed8->_node);
      xpath_node_set_raw::push_back
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                 (xpath_allocator *)in_stack_fffffffffffffee0);
    }
  }
  return (xpath_node_set_raw *)pxVar4;
}

Assistant:

xpath_node_set_raw eval_node_set(const xpath_context& c, const xpath_stack& stack, nodeset_eval_t eval)
		{
			switch (_type)
			{
			case ast_op_union:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_node_set_raw ls = _left->eval_node_set(c, stack, eval);
				xpath_node_set_raw rs = _right->eval_node_set(c, swapped_stack, eval);

				// we can optimize merging two sorted sets, but this is a very rare operation, so don't bother
				ls.set_type(xpath_node_set::type_unsorted);

				ls.append(rs.begin(), rs.end(), stack.result);
				ls.remove_duplicates(stack.temp);

				return ls;
			}

			case ast_filter:
			{
				xpath_node_set_raw set = _left->eval_node_set(c, stack, _test == predicate_constant_one ? nodeset_eval_first : nodeset_eval_all);

				// either expression is a number or it contains position() call; sort by document order
				if (_test != predicate_posinv) set.sort_do();

				bool once = eval_once(set.type(), eval);

				apply_predicate(set, 0, stack, once);

				return set;
			}

			case ast_func_id:
				return xpath_node_set_raw();

			case ast_step:
			{
				switch (_axis)
				{
				case axis_ancestor:
					return step_do(c, stack, eval, axis_to_type<axis_ancestor>());

				case axis_ancestor_or_self:
					return step_do(c, stack, eval, axis_to_type<axis_ancestor_or_self>());

				case axis_attribute:
					return step_do(c, stack, eval, axis_to_type<axis_attribute>());

				case axis_child:
					return step_do(c, stack, eval, axis_to_type<axis_child>());

				case axis_descendant:
					return step_do(c, stack, eval, axis_to_type<axis_descendant>());

				case axis_descendant_or_self:
					return step_do(c, stack, eval, axis_to_type<axis_descendant_or_self>());

				case axis_following:
					return step_do(c, stack, eval, axis_to_type<axis_following>());

				case axis_following_sibling:
					return step_do(c, stack, eval, axis_to_type<axis_following_sibling>());

				case axis_namespace:
					// namespaced axis is not supported
					return xpath_node_set_raw();

				case axis_parent:
					return step_do(c, stack, eval, axis_to_type<axis_parent>());

				case axis_preceding:
					return step_do(c, stack, eval, axis_to_type<axis_preceding>());

				case axis_preceding_sibling:
					return step_do(c, stack, eval, axis_to_type<axis_preceding_sibling>());

				case axis_self:
					return step_do(c, stack, eval, axis_to_type<axis_self>());

				default:
					assert(false && "Unknown axis"); // unreachable
					return xpath_node_set_raw();
				}
			}

			case ast_step_root:
			{
				assert(!_right); // root step can't have any predicates

				xpath_node_set_raw ns;

				ns.set_type(xpath_node_set::type_sorted);

				if (c.n.node()) ns.push_back(c.n.node().root(), stack.result);
				else if (c.n.attribute()) ns.push_back(c.n.parent().root(), stack.result);

				return ns;
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_node_set)
				{
					const xpath_node_set& s = _data.variable->get_node_set();

					xpath_node_set_raw ns;

					ns.set_type(s.type());
					ns.append(s.begin(), s.end(), stack.result);

					return ns;
				}
			}

			// fallthrough
			default:
				assert(false && "Wrong expression for return type node set"); // unreachable
				return xpath_node_set_raw();
			}
		}